

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

fdb_status compactor_set_compaction_interval(filemgr *file,size_t interval)

{
  avl_node *paVar1;
  avl_node *in_RSI;
  undefined8 *in_RDI;
  fdb_status result;
  openfiles_elem_conflict *elem;
  openfiles_elem_conflict query;
  avl_node *a;
  fdb_status local_564;
  avl_cmp_func *in_stack_fffffffffffffaa8;
  avl_node *in_stack_fffffffffffffab0;
  avl_tree *in_stack_fffffffffffffab8;
  
  local_564 = FDB_RESULT_SUCCESS;
  strcpy(&stack0xfffffffffffffaa8,(char *)*in_RDI);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8)
  ;
  if (paVar1 == (avl_node *)0x0) {
    local_564 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    paVar1[1].right = in_RSI;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return local_564;
}

Assistant:

fdb_status compactor_set_compaction_interval(struct filemgr *file,
                                             size_t interval)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;
    fdb_status result = FDB_RESULT_SUCCESS;

    strcpy(query.filename, file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        elem->interval = interval;
    } else {
        result = FDB_RESULT_INVALID_ARGS;
    }
    mutex_unlock(&cpt_lock);
    return result;
}